

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O3

void __thiscall
SuffixTree::GeneralizedSuffixTree::Move(GeneralizedSuffixTree *this,uint string,uint pos)

{
  pointer pbVar1;
  mapped_type *pmVar2;
  uint uVar3;
  Node *pNVar4;
  ulong uVar5;
  
  uVar5 = (ulong)string;
  pbVar1 = (this->strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar5 < (ulong)((long)(this->strings).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) &&
     ((ulong)pos <= pbVar1[uVar5]._M_string_length)) {
    if (this->active_length != 0) {
      pNVar4 = this->active_node;
      do {
        this->active_edge =
             (int)(this->strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p[pos];
        pmVar2 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&pNVar4->edges,&this->active_edge);
        uVar3 = pmVar2->length;
        if (this->active_length <= uVar3 - 1) {
          return;
        }
        pos = pos + uVar3;
        pNVar4 = (pmVar2->field_0).node;
        this->active_node = pNVar4;
        uVar3 = this->active_length - uVar3;
        this->active_length = uVar3;
      } while (uVar3 != 0);
    }
    return;
  }
  __assert_fail("string < strings.size() && pos <= strings[string].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0x105,"void SuffixTree::GeneralizedSuffixTree::Move(uint, uint)");
}

Assistant:

void GeneralizedSuffixTree::Move (uint string, uint pos)
{
    assert (string < strings.size() && pos <= strings[string].size());
	for (;;)
    {
        if (!active_length)
            break;
        active_edge = static_cast<uint> (strings[string][pos]);
        Edge &edge = active_node->edges[active_edge];
        if (!edge.length)
            break;
        if (active_length < edge.length)
            break;
        pos += edge.length;
        active_node = edge.node;
        active_length -= edge.length;
    }
}